

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

bool __thiscall xmrig::Client::parseJob(Client *this,Value *params,int *code)

{
  Job *this_00;
  bool bVar1;
  type tVar2;
  Type pGVar3;
  char *pcVar4;
  long lVar5;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  int __fd;
  uint uVar6;
  Type pGVar7;
  ulong uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  uint64_t t_stamp;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_140;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_138;
  Job job;
  Job *other;
  
  if ((params->data_).f.flags != 3) {
    *code = 2;
    return false;
  }
  Job::Job(&job,&this->m_rpcId);
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)params,"job_id");
  pGVar7 = (Type)((ulong)(pGVar3->data_).s.str & 0xffffffffffff);
  if (((pGVar3->data_).f.flags >> 0xc & 1) != 0) {
    pGVar7 = pGVar3;
  }
  bVar1 = Job::setId(&job,(char *)pGVar7);
  if (bVar1) {
    if ((this->super_BaseClient).m_pool.m_mode == MODE_SELF_SELECT) {
      pcVar4 = Json::getString(params,"extra_nonce",(char *)0x0);
      String::String((String *)&b,pcVar4);
      String::copy(&job.m_extraNonce,(EVP_PKEY_CTX *)&b,src);
      String::~String((String *)&b);
      pcVar4 = Json::getString(params,"pool_wallet",(char *)0x0);
      String::String((String *)&b,pcVar4);
      String::copy(&job.m_poolWallet,(EVP_PKEY_CTX *)&b,src_00);
      String::~String((String *)&b);
      if ((job.m_extraNonce.m_data == (char *)0x0) || (job.m_poolWallet.m_data == (char *)0x0)) {
LAB_00152964:
        *code = 4;
        goto LAB_001529ab;
      }
    }
    else {
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)params,"blob");
      pGVar7 = (Type)((ulong)(pGVar3->data_).s.str & 0xffffffffffff);
      if (((pGVar3->data_).f.flags >> 0xc & 1) != 0) {
        pGVar7 = pGVar3;
      }
      bVar1 = Job::setBlob(&job,(char *)pGVar7);
      if (!bVar1) goto LAB_00152964;
    }
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)params,"target");
    pGVar7 = (Type)((ulong)(pGVar3->data_).s.str & 0xffffffffffff);
    if (((pGVar3->data_).f.flags >> 0xc & 1) != 0) {
      pGVar7 = pGVar3;
    }
    bVar1 = Job::setTarget(&job,(char *)pGVar7);
    if (bVar1) {
      job.m_height = Json::getUint64(params,"height",0);
      String::copy(&(this->super_BaseClient).m_job.m_clientId,(EVP_PKEY_CTX *)&this->m_rpcId,src_01)
      ;
      this_00 = &(this->super_BaseClient).m_job;
      other = &job;
      bVar1 = Job::operator!=(this_00,other);
      __fd = (int)other;
      if (bVar1) {
        this->m_jobs = this->m_jobs + 1;
        Job::operator=(this_00,&job);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&b,
                   (this->super_BaseClient).m_job.m_blob + 2,
                   (this->super_BaseClient).m_job.m_blob +
                   ((this->super_BaseClient).m_job.m_size - 2),(allocator_type *)&t_stamp);
        t_stamp = 0;
        local_138._M_current =
             b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_140._M_current =
             b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        tVar2 = std::enable_if<((std::is_integral<unsigned_long>::value&&std::
                is_unsigned<unsigned_long>::value)&&((0)<=(64)))&&((64)<=std::
                numeric_limits<unsigned_long>::digits),int>::type_tools::read_varint<64,__gnu_cxx::
                __normal_iterator<unsigned_char*,std::vector<unsigned_char,std::
                allocator<unsigned_char>>>_unsigned_long>(&local_138,&local_140,&t_stamp);
        lVar5 = (long)tVar2;
        uVar6 = (uint)b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5 + 1] << 8 |
                (uint)b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5] << 0x10 |
                (uint)b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5 + 2];
        uVar8 = (ulong)((int)(t_stamp % (ulong)(uVar6 + (uVar6 == 0))) + (int)job.m_height & 0x7fff)
        ;
        printf("%lu\n",uVar8 + 0x40000);
        (this->super_BaseClient).m_job.m_extraIters = uVar8;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        bVar1 = true;
        goto LAB_001529ad;
      }
      if (this->m_jobs != 0) {
        if (((this->super_BaseClient).m_quiet == false) &&
           ((this->super_BaseClient).m_failures < (long)(this->super_BaseClient).m_retries)) {
          __fd = 0x1925f4;
          Log::print(WARNING,"[%s] duplicate job received, reconnect",
                     (this->super_BaseClient).m_pool.m_url.m_url.m_data);
        }
        close(this,__fd);
      }
    }
    else {
      *code = 5;
    }
  }
  else {
    *code = 3;
  }
LAB_001529ab:
  bVar1 = false;
LAB_001529ad:
  Job::~Job(&job);
  return bVar1;
}

Assistant:

bool xmrig::Client::parseJob(const rapidjson::Value &params, int *code)
{
    if (!params.IsObject()) {
        *code = 2;
        return false;
    }

    Job job(m_rpcId);

    if (!job.setId(params["job_id"].GetString())) {
        *code = 3;
        return false;
    }

#   ifdef XMRIG_FEATURE_HTTP
    if (m_pool.mode() == Pool::MODE_SELF_SELECT) {
        job.setExtraNonce(Json::getString(params, "extra_nonce"));
        job.setPoolWallet(Json::getString(params, "pool_wallet"));

        if (job.extraNonce().isNull() || job.poolWallet().isNull()) {
            *code = 4;
            return false;
        }
    }
    else
#   endif
    {
        if (!job.setBlob(params["blob"].GetString())) {
            *code = 4;
            return false;
        }
    }

    if (!job.setTarget(params["target"].GetString())) {
        *code = 5;
        return false;
    }

    job.setHeight(Json::getUint64(params, "height"));
    m_job.setClientId(m_rpcId);

    if (m_job != job)
    {
        m_jobs++;
        m_job = std::move(job);

        const uint8_t* blob = m_job.blob();
        size_t blob_size = m_job.size();

        std::vector<uint8_t> b(blob + 2, blob + (blob_size - 2));
        uint64_t t_stamp = 0;
        int read = tools::read_varint(b.begin(), b.end(), t_stamp);

        uint8_t id_num_bytes[4] = {0};
        id_num_bytes[2] = b[read++];
        id_num_bytes[1] = b[read++];
        id_num_bytes[0] = b[read++];

        uint32_t id_num = *((uint32_t*)id_num_bytes);

        if (id_num < 1)
            id_num = 1;

        uint64_t extra_iters = ((t_stamp % id_num) + job.height()) & 0x7FFF;

        printf("%lu\n", 0x40000 + extra_iters);

        m_job.setExtraIters(extra_iters);
        
        return true;
    }

    if (m_jobs == 0) { // https://github.com/xmrig/xmrig/issues/459
        return false;
    }

    if (!isQuiet()) {
        LOG_WARN("[%s] duplicate job received, reconnect", url());
    }

    close();
    return false;
}